

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::try_emplace_impl<unsigned_long>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *this,unsigned_long *k)

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
  *res;
  tuple<unsigned_long_&&> local_30;
  ctrl_t *local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  unsigned_long *local_18;
  unsigned_long *k_local;
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (unsigned_long *)this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::find_or_prepare_insert<unsigned_long>
            (__return_storage_ptr__,
             &this->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_28 = (__return_storage_ptr__->first).ctrl_;
    local_20 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<unsigned_long>((unsigned_long *)&local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_20.slot_;
    iter.ctrl_ = local_28;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,absl::lts_20250127::hash_internal::Hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_long&&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,unsigned_long>,absl::lts_20250127::hash_internal::Hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_30,
               (tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }